

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O0

PVIP_BOOL PVIP_string_vprintf(PVIPString *str,char *format,__va_list_tag *ap)

{
  int iVar1;
  char *pcVar2;
  undefined1 auStack_48 [4];
  int size;
  va_list copied;
  __va_list_tag *ap_local;
  char *format_local;
  PVIPString *str_local;
  
  copied[0].overflow_arg_area = ap->reg_save_area;
  auStack_48 = ap->gp_offset;
  unique0x1000008b = ap->fp_offset;
  copied[0]._0_8_ = ap->overflow_arg_area;
  iVar1 = vsnprintf(str->buf + str->len,str->buflen - str->len,format,ap);
  if (str->buflen - str->len < (ulong)(long)(iVar1 + 1)) {
    str->buflen = (long)(iVar1 + 1) + str->buflen;
    pcVar2 = (char *)realloc(str->buf,str->buflen);
    str->buf = pcVar2;
    if (str->buf == (char *)0x0) {
      str_local._4_4_ = 0;
    }
    else {
      str_local._4_4_ = PVIP_string_vprintf(str,format,(__va_list_tag *)auStack_48);
    }
  }
  else {
    str->len = (long)iVar1 + str->len;
    str_local._4_4_ = 1;
  }
  return str_local._4_4_;
}

Assistant:

PVIP_BOOL PVIP_string_vprintf(PVIPString *str, const char*format, va_list ap) {
    va_list copied;
    va_copy(copied, ap); // copy original va_list

    int size = vsnprintf(str->buf + str->len, str->buflen - str->len, format, ap);
    if (size+1 > str->buflen - str->len) {
        str->buflen += size + 1;
        str->buf    = realloc(str->buf, str->buflen);
        if (!str->buf) {
            return PVIP_FALSE;
        }
        return PVIP_string_vprintf(str, format, copied);
    }
    str->len += size;
    return PVIP_TRUE;
}